

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O2

size_t spdlog::details::os::thread_id(void)

{
  size_t sVar1;
  long in_FS_OFFSET;
  
  if (*(char *)(in_FS_OFFSET + -0x40) != '\x01') {
    sVar1 = _thread_id();
    *(size_t *)(in_FS_OFFSET + -0x48) = sVar1;
    *(undefined1 *)(in_FS_OFFSET + -0x40) = 1;
  }
  return *(size_t *)(in_FS_OFFSET + -0x48);
}

Assistant:

SPDLOG_INLINE size_t thread_id() SPDLOG_NOEXCEPT {
#if defined(SPDLOG_NO_TLS)
    return _thread_id();
#else  // cache thread id in tls
    static thread_local const size_t tid = _thread_id();
    return tid;
#endif
}